

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<kj::AppendableFile,_std::nullptr_t> __thiscall
kj::Directory::appendFile(Directory *this,PathPtr path,WriteMode mode)

{
  Clock *clock;
  undefined4 in_register_0000000c;
  AppendableFile *extraout_RDX;
  AppendableFile *extraout_RDX_00;
  AppendableFile *pAVar1;
  ulong in_R8;
  Own<kj::AppendableFile,_std::nullptr_t> OVar2;
  Fault f;
  AppendableFile *local_60;
  OwnOwn<kj::AppendableFile,_std::nullptr_t> _f595;
  PathPtr path_local;
  Own<const_kj::File,_std::nullptr_t> local_38;
  
  path_local.parts.size_ = CONCAT44(in_register_0000000c,mode);
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x80))(&f);
  _f595.value.disposer = (Disposer *)f.exception;
  _f595.value.ptr = local_60;
  Own<kj::AppendableFile,_std::nullptr_t>::dispose((Own<kj::AppendableFile,_std::nullptr_t> *)&f);
  if (local_60 == (AppendableFile *)0x0) {
    if ((in_R8 & 1) == 0) {
      if ((in_R8 & 2) == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58],kj::PathPtr&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x25a,FAILED,(char *)0x0,
                   "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\", path",
                   (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given",
                   &path_local);
        kj::_::Debug::Fault::~Fault(&f);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,600,FAILED,(char *)0x0,"\"file does not exist\", path",
                   (char (*) [20])"file does not exist",&path_local);
        kj::_::Debug::Fault::~Fault(&f);
      }
    }
    else if ((in_R8 & 2) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x256,FAILED,(char *)0x0,"\"file already exists\", path",
                 (char (*) [20])"file already exists",&path_local);
      kj::_::Debug::Fault::~Fault(&f);
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x25d,FAILED,(char *)0x0,
                 "\"tryAppendFile() returned null despite no preconditions\", path",
                 (char (*) [55])"tryAppendFile() returned null despite no preconditions",&path_local
                );
      kj::_::Debug::Fault::~Fault(&f);
    }
  }
  else {
    (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f.exception;
    this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)local_60;
    _f595.value.ptr = (AppendableFile *)0x0;
  }
  Own<kj::AppendableFile,_std::nullptr_t>::dispose(&_f595.value);
  pAVar1 = extraout_RDX;
  if (local_60 == (AppendableFile *)0x0) {
    clock = nullClock();
    newInMemoryFile((kj *)&_f595,clock);
    local_38.disposer = _f595.value.disposer;
    local_38.ptr = (File *)_f595.value.ptr;
    _f595.value.ptr = (AppendableFile *)0x0;
    newFileAppender((kj *)this,&local_38);
    Own<const_kj::File,_std::nullptr_t>::dispose(&local_38);
    Own<kj::File,_std::nullptr_t>::dispose((Own<kj::File,_std::nullptr_t> *)&_f595);
    pAVar1 = extraout_RDX_00;
  }
  OVar2.ptr = pAVar1;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<AppendableFile> Directory::appendFile(PathPtr path, WriteMode mode) const {
  KJ_IF_SOME(f, tryAppendFile(path, mode)) {
    return kj::mv(f);
  } else if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("file already exists", path) { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("file does not exist", path) { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given", path) { break; }
  } else {
    // Shouldn't happen.
    KJ_FAIL_ASSERT("tryAppendFile() returned null despite no preconditions", path) { break; }